

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Poller.cpp
# Opt level: O2

void __thiscall hwnet::Poller::Remove(Poller *this,Ptr *channel)

{
  mutex *__mutex;
  atomic_int *paVar1;
  int iVar2;
  iterator __it;
  key_type local_34;
  
  __mutex = &this->mtx;
  std::mutex::lock(__mutex);
  (*((channel->super___shared_ptr<hwnet::Channel,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
    _vptr_Channel[1])();
  __it = std::
         _Hashtable<int,_std::pair<const_int,_std::shared_ptr<hwnet::Channel>_>,_std::allocator<std::pair<const_int,_std::shared_ptr<hwnet::Channel>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
         ::find(&(this->channels)._M_h,&local_34);
  if (__it.super__Node_iterator_base<std::pair<const_int,_std::shared_ptr<hwnet::Channel>_>,_false>.
      _M_cur == (__node_type *)0x0) {
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
  }
  else {
    std::__cxx11::
    list<std::shared_ptr<hwnet::Channel>,_std::allocator<std::shared_ptr<hwnet::Channel>_>_>::
    push_back(&this->waitRemove,channel);
    std::
    _Hashtable<int,_std::pair<const_int,_std::shared_ptr<hwnet::Channel>_>,_std::allocator<std::pair<const_int,_std::shared_ptr<hwnet::Channel>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
    ::erase(&(this->channels)._M_h,
            (const_iterator)
            __it.
            super__Node_iterator_base<std::pair<const_int,_std::shared_ptr<hwnet::Channel>_>,_false>
            ._M_cur);
    Epoll::Remove(&this->poller_,channel);
    LOCK();
    paVar1 = &this->clearWaitRemove;
    iVar2 = (paVar1->super___atomic_base<int>)._M_i;
    (paVar1->super___atomic_base<int>)._M_i = (paVar1->super___atomic_base<int>)._M_i + 1;
    UNLOCK();
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
    if (iVar2 == 0) {
      notifyChannel::notify
                ((this->notifyChannel_).
                 super___shared_ptr<hwnet::Poller::notifyChannel,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                );
    }
  }
  return;
}

Assistant:

void Poller::Remove(const Channel::Ptr &channel) {
	this->mtx.lock();
	auto it = this->channels.find(channel->Fd());
	if(it == this->channels.end()){
		this->mtx.unlock();
		return;		
	}
	this->waitRemove.push_back(channel);
	this->channels.erase(it);
	poller_.Remove(channel);
	auto needNotify = ++clearWaitRemove == 1;
	this->mtx.unlock();
	if(needNotify) {
		this->notifyChannel_->notify();
	}
}